

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O1

ExtensionRange * __thiscall
google::protobuf::Descriptor::FindExtensionRangeContainingNumber(Descriptor *this,int number)

{
  Nonnull<const_char_*> pcVar1;
  long lVar2;
  long v1;
  
  if (0 < this->extension_range_count_) {
    lVar2 = 0;
    v1 = 0;
    do {
      if (*(int *)((long)&this->extension_ranges_->start_ + lVar2) <= number) {
        if (v1 < this->extension_range_count_) {
          pcVar1 = (Nonnull<const_char_*>)0x0;
        }
        else {
          pcVar1 = absl::lts_20250127::log_internal::MakeCheckOpString<long,long>
                             (v1,(long)this->extension_range_count_,
                              "index < extension_range_count()");
        }
        if (pcVar1 != (Nonnull<const_char_*>)0x0) {
          FindExtensionRangeContainingNumber();
LAB_00153727:
          FindExtensionRangeContainingNumber();
        }
        if (number < *(int *)((long)&this->extension_ranges_->end_ + lVar2)) {
          if ((int)v1 < this->extension_range_count_) {
            pcVar1 = (Nonnull<const_char_*>)0x0;
          }
          else {
            pcVar1 = absl::lts_20250127::log_internal::MakeCheckOpString<long,long>
                               (v1,(long)this->extension_range_count_,
                                "index < extension_range_count()");
          }
          if (pcVar1 == (Nonnull<const_char_*>)0x0) {
            return (ExtensionRange *)((long)&this->extension_ranges_->start_ + lVar2);
          }
          goto LAB_00153727;
        }
      }
      v1 = v1 + 1;
      lVar2 = lVar2 + 0x28;
    } while (v1 < this->extension_range_count_);
  }
  return (ExtensionRange *)0x0;
}

Assistant:

const Descriptor::ExtensionRange*
Descriptor::FindExtensionRangeContainingNumber(int number) const {
  // Linear search should be fine because we don't expect a message to have
  // more than a couple extension ranges.
  for (int i = 0; i < extension_range_count(); i++) {
    if (number >= extension_range(i)->start_number() &&
        number < extension_range(i)->end_number()) {
      return extension_range(i);
    }
  }
  return nullptr;
}